

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgettextcontrol.cpp
# Opt level: O0

bool __thiscall
QWidgetTextControlPrivate::dragEnterEvent
          (QWidgetTextControlPrivate *this,QEvent *e,QMimeData *mimeData)

{
  bool bVar1;
  QWidgetTextControl *pQVar2;
  undefined8 in_RDX;
  QEvent *in_RSI;
  QWidgetTextControlPrivate *in_RDI;
  long in_FS_OFFSET;
  QWidgetTextControl *q;
  undefined4 in_stack_ffffffffffffffa8;
  TextInteractionFlag in_stack_ffffffffffffffac;
  byte local_41;
  bool local_19;
  QTextCursor local_18 [12];
  QFlagsStorageHelper<Qt::TextInteractionFlag,_4> local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = q_func(in_RDI);
  local_c.super_QFlagsStorage<Qt::TextInteractionFlag>.i =
       (QFlagsStorage<Qt::TextInteractionFlag>)
       QFlags<Qt::TextInteractionFlag>::operator&
                 ((QFlags<Qt::TextInteractionFlag> *)in_RDI,in_stack_ffffffffffffffac);
  bVar1 = QFlags<Qt::TextInteractionFlag>::operator!((QFlags<Qt::TextInteractionFlag> *)&local_c);
  local_41 = 1;
  if (!bVar1) {
    local_41 = (**(code **)(*(long *)pQVar2 + 0xa0))(pQVar2,in_RDX);
    local_41 = local_41 ^ 0xff;
  }
  local_19 = (local_41 & 1) != 0;
  if (local_19) {
    QEvent::ignore(in_RSI);
  }
  else {
    QTextCursor::QTextCursor(local_18);
    QTextCursor::operator=
              ((QTextCursor *)in_RDI,
               (QTextCursor *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    QTextCursor::~QTextCursor(local_18);
  }
  local_19 = !local_19;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_19;
  }
  __stack_chk_fail();
}

Assistant:

bool QWidgetTextControlPrivate::dragEnterEvent(QEvent *e, const QMimeData *mimeData)
{
    Q_Q(QWidgetTextControl);
    if (!(interactionFlags & Qt::TextEditable) || !q->canInsertFromMimeData(mimeData)) {
        e->ignore();
        return false;
    }

    dndFeedbackCursor = QTextCursor();

    return true; // accept proposed action
}